

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::AddLabel(PrintVisitor *this,string *label)

{
  string local_58 [32];
  undefined1 local_38 [40];
  string *label_local;
  PrintVisitor *this_local;
  
  local_38._32_8_ = label;
  label_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)label);
  ConstructLabel((PrintVisitor *)local_38,(string *)this,(int)local_58);
  std::__cxx11::string::operator+=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void IRT::PrintVisitor::AddLabel( std::string label ) {
    this->description += ConstructLabel( label, lastVisited + 1 );
}